

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_things.cpp
# Opt level: O2

void ParseSpawnMap(FScanner *sc,SpawnMap *themap,char *descript)

{
  uint key;
  bool bVar1;
  bool *pbVar2;
  Node *pNVar3;
  char *message;
  MapinfoSpawnItem editem;
  TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> defined;
  MapinfoSpawnItem local_60;
  TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> local_48;
  
  TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_>::TMap(&local_48);
  local_60.classname.Index = 0;
  local_60.filename.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  FString::operator=(&local_60.filename,&sc->ScriptName);
  while( true ) {
    bVar1 = FScanner::CheckString(sc,"}");
    if (bVar1) break;
    bVar1 = FScanner::CheckNumber(sc);
    if (bVar1) {
      key = sc->Number;
      FScanner::MustGetStringName(sc,"=");
      FScanner::MustGetString(sc);
      pbVar2 = TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_>::CheckKey(&local_48,key);
      message = "%s %d defined more than once";
      if ((pbVar2 != (bool *)0x0) || (message = "%s must be positive, got %d", (int)key < 0)) {
        FScanner::ScriptMessage(sc,message,descript,(ulong)key);
      }
      pNVar3 = TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_>::GetNode(&local_48,key);
      (pNVar3->Pair).Value = true;
      FName::operator=(&local_60.classname,sc->String);
      local_60.linenum = sc->Line;
      TMap<int,_MapinfoSpawnItem,_THashTraits<int>,_TValueTraits<MapinfoSpawnItem>_>::Insert
                (themap,key,&local_60);
    }
    else {
      FScanner::ScriptError(sc,"Number expected");
    }
  }
  FString::~FString(&local_60.filename);
  TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_>::~TMap(&local_48);
  return;
}

Assistant:

static void ParseSpawnMap(FScanner &sc, SpawnMap & themap, const char *descript)
{
	TMap<int, bool> defined;
	int error = 0;

	MapinfoSpawnItem editem;

	editem.filename = sc.ScriptName;

	while (true)
	{
		if (sc.CheckString("}")) return;
		else if (sc.CheckNumber())
		{
			int ednum = sc.Number;
			sc.MustGetStringName("=");
			sc.MustGetString();

			bool *def = defined.CheckKey(ednum);
			if (def != NULL)
			{
				sc.ScriptMessage("%s %d defined more than once", descript, ednum);
				error++;
			}
			else if (ednum < 0)
			{
				sc.ScriptMessage("%s must be positive, got %d", descript, ednum);
				error++;
			}
			defined[ednum] = true;
			editem.classname = sc.String;
			editem.linenum = sc.Line;

			themap.Insert(ednum, editem);
		}
		else
		{
			sc.ScriptError("Number expected");
		}
	}
	if (error > 0)
	{
		sc.ScriptError("%d errors encountered in %s definition", error, descript);
	}
}